

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O1

void __thiscall Assimp::ObjFile::Object::~Object(Object *this)

{
  Object *this_00;
  pointer puVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppOVar4;
  
  ppOVar4 = (this->m_SubObjects).
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar4 !=
      (this->m_SubObjects).
      super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppOVar4;
      if (this_00 != (Object *)0x0) {
        ~Object(this_00);
        operator_delete(this_00,0x90);
      }
      ppOVar4 = ppOVar4 + 1;
    } while (ppOVar4 !=
             (this->m_SubObjects).
             super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  puVar1 = (this->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_Meshes).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  ppOVar4 = (this->m_SubObjects).
            super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppOVar4 != (pointer)0x0) {
    operator_delete(ppOVar4,(long)(this->m_SubObjects).
                                  super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar4
                   );
  }
  pcVar2 = (this->m_strObjName)._M_dataplus._M_p;
  paVar3 = &(this->m_strObjName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Object() {
        for ( std::vector<Object*>::iterator it = m_SubObjects.begin(); it != m_SubObjects.end(); ++it) {
            delete *it;
        }
    }